

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::remove_clipboard_notify(Fl_Clipboard_Notify_Handler h)

{
  Clipboard_Notify **local_20;
  Clipboard_Notify **prev;
  Clipboard_Notify *node;
  Fl_Clipboard_Notify_Handler h_local;
  
  prev = (Clipboard_Notify **)clip_notify_list;
  local_20 = &clip_notify_list;
  while( true ) {
    if (prev == (Clipboard_Notify **)0x0) {
      return;
    }
    if (*prev == (Clipboard_Notify *)h) break;
    local_20 = prev + 2;
    prev = (Clipboard_Notify **)prev[2];
  }
  *local_20 = prev[2];
  if (prev != (Clipboard_Notify **)0x0) {
    operator_delete(prev,0x18);
  }
  fl_clipboard_notify_change();
  return;
}

Assistant:

void Fl::remove_clipboard_notify(Fl_Clipboard_Notify_Handler h) {
  struct Clipboard_Notify *node, **prev;

  node = clip_notify_list;
  prev = &clip_notify_list;
  while (node != NULL) {
    if (node->handler == h) {
      *prev = node->next;
      delete node;

      fl_clipboard_notify_change();

      return;
    }

    prev = &node->next;
    node = node->next;
  }
}